

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_disconnect(connectdata *conn,_Bool dead_connection)

{
  CURLcode CVar1;
  pop3_conn *pop3c;
  _Bool dead_connection_local;
  connectdata *conn_local;
  
  if ((((!dead_connection) && ((conn->proto).ftpc.pp.conn != (connectdata *)0x0)) &&
      ((*(byte *)((conn->proto).sshc.readdir_len + 0x39f) & 1) != 0)) &&
     (CVar1 = pop3_perform_quit(conn), CVar1 == CURLE_OK)) {
    pop3_block_statemach(conn);
  }
  Curl_pp_disconnect(&(conn->proto).ftpc.pp);
  Curl_sasl_cleanup(conn,(conn->proto).imapc.cmdid);
  (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
  (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_disconnect(struct connectdata *conn, bool dead_connection)
{
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  /* The POP3 session may or may not have been allocated/setup at this
     point! */
  if(!dead_connection && pop3c->pp.conn && pop3c->pp.conn->bits.protoconnstart)
    if(!pop3_perform_quit(conn))
      (void)pop3_block_statemach(conn); /* ignore errors on QUIT */

  /* Disconnect from the server */
  Curl_pp_disconnect(&pop3c->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, pop3c->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(pop3c->apoptimestamp);

  return CURLE_OK;
}